

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

bool __thiscall
jsonnet::internal::FixNewlines::shouldExpand(FixNewlines *this,ObjectComprehension *comp)

{
  pointer pOVar1;
  pointer pCVar2;
  int iVar3;
  Fodder *fodder;
  pointer pOVar4;
  pointer pCVar5;
  
  pOVar4 = (comp->fields).
           super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pOVar1 = (comp->fields).
           super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pOVar4 == pOVar1) {
      pCVar5 = (comp->specs).
               super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pCVar2 = (comp->specs).
               super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      do {
        if (pCVar5 == pCVar2) {
          iVar3 = countNewlines(&comp->closeFodder);
          return 0 < iVar3;
        }
        iVar3 = countNewlines(&pCVar5->openFodder);
        pCVar5 = pCVar5 + 1;
      } while (iVar3 < 1);
      return true;
    }
    fodder = &pOVar4->fodder1;
    if (pOVar4->kind == FIELD_STR) {
      fodder = &pOVar4->expr1->openFodder;
    }
    iVar3 = countNewlines(fodder);
    pOVar4 = pOVar4 + 1;
  } while (iVar3 < 1);
  return true;
}

Assistant:

bool shouldExpand(ObjectComprehension *comp)
    {
        for (auto &field : comp->fields) {
            if (countNewlines(objectFieldOpenFodder(field)) > 0) {
                return true;
            }
        }
        for (auto &spec : comp->specs) {
            if (countNewlines(spec.openFodder) > 0) {
                return true;
            }
        }
        if (countNewlines(comp->closeFodder) > 0) {
            return true;
        }
        return false;
    }